

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uchar **ppuVar1;
  Half **ppHVar2;
  float **ppfVar3;
  optional<pbrt::SquareMatrix<4>_> *poVar4;
  undefined1 *puVar5;
  char *__s1;
  bool bVar6;
  int iVar7;
  char **ppcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  Allocator AVar14;
  FILE *pFVar15;
  byte bVar16;
  _Any_data *onError;
  undefined8 uVar17;
  int iVar18;
  size_t *psVar19;
  int c;
  int iVar20;
  Point2i p;
  char *pcVar21;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  uint64_t oldstate;
  ulong uVar22;
  long lVar23;
  int iVar24;
  undefined1 auVar25 [16];
  Float FVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined4 uVar29;
  undefined1 in_XMM3 [16];
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  int width;
  int nInstances;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  char **argv_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  array<int,_2UL> pixel;
  int local_3b4;
  int vb;
  int va;
  Float sigma;
  string local_398;
  string filename;
  string local_358;
  string local_338;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  code *local_2a8;
  code *local_2a0;
  ColorEncodingHandle local_298;
  ImageAndMetadata imRead;
  Image image;
  ImageChannelDesc rgbDesc;
  undefined1 extraout_var [60];
  
  ppuVar1 = &imRead.image.p8.ptr;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y._0_1_ = 0;
  imRead.image.format = U256;
  imRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  imRead.image._12_4_ = 1;
  imRead.image.channelNames.alloc.memoryResource._0_4_ = 0;
  imRead.image.channelNames.alloc.memoryResource._4_4_ = 1;
  imRead.image.channelNames.ptr._0_2_ = 0;
  imRead.image.channelNames._12_8_ = 0;
  imRead.image.channelNames._20_8_ = 0;
  imRead.image.channelNames.nStored._4_2_ = 0;
  imRead.image.p8.alloc.memoryResource = (memory_resource *)0x0;
  imRead.image.p8.ptr._0_1_ = 0;
  ppHVar2 = &imRead.image.p16.ptr;
  imRead.image.p16.alloc.memoryResource = (memory_resource *)0x0;
  imRead.image.p16.ptr._0_1_ = 0;
  ppfVar3 = &imRead.image.p32.ptr;
  imRead.image.p32.alloc.memoryResource = (memory_resource *)0x0;
  imRead.image.p32.ptr._0_1_ = 0;
  poVar4 = &imRead.metadata.cameraFromWorld;
  imRead.metadata.renderTimeSeconds.optionalValue =
       (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  imRead.metadata.renderTimeSeconds.set = false;
  imRead.metadata.renderTimeSeconds._5_3_ = 0;
  imRead.metadata.cameraFromWorld.optionalValue.__data[0] = '\0';
  puVar5 = (undefined1 *)((long)&imRead.metadata.cameraFromWorld.optionalValue + 0x20);
  imRead.metadata.cameraFromWorld.optionalValue._24_8_ = 0;
  imRead.metadata.cameraFromWorld.optionalValue.__data[0x20] = '\0';
  imRead.metadata.cameraFromWorld.optionalValue._48_16_ = SUB3216(ZEXT432(0),0) << 0x40;
  imRead.metadata.NDCFromWorld.optionalValue._12_4_ = 0;
  imRead.metadata.NDCFromWorld.optionalValue.__data[0x10] = '\0';
  imRead.metadata.NDCFromWorld.optionalValue._17_11_ = (undefined1  [11])0x0;
  imRead.metadata.NDCFromWorld.optionalValue._28_4_ = 0;
  imRead.metadata.cameraFromWorld.set = false;
  imRead.metadata.cameraFromWorld._65_3_ = 0;
  imRead.metadata.NDCFromWorld.optionalValue._0_12_ = (undefined1  [12])0x0;
  argv_local = argv;
  imRead.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )ppuVar1;
  imRead.image.p8.nStored = (size_t)ppHVar2;
  imRead.image.p16.nStored = (size_t)ppfVar3;
  imRead.image.p32.nStored = (size_t)poVar4;
  imRead.metadata.cameraFromWorld.optionalValue._16_8_ = puVar5;
  pbrt::InitPBRT((PBRTOptions *)&imRead);
  if (imRead.metadata.NDCFromWorld.optionalValue.__data[0x1c] == '\x01') {
    imRead.metadata.NDCFromWorld.optionalValue._28_4_ =
         imRead.metadata.NDCFromWorld.optionalValue._28_4_ & 0xffffff00;
  }
  if (imRead.metadata.NDCFromWorld.optionalValue.__data[0x10] == '\x01') {
    imRead.metadata.NDCFromWorld.optionalValue.__data[0x10] = '\0';
  }
  if (imRead.metadata.cameraFromWorld.set == true) {
    imRead.metadata.cameraFromWorld._64_4_ = imRead.metadata.cameraFromWorld._64_4_ & 0xffffff00;
  }
  if ((undefined1 *)imRead.metadata.cameraFromWorld.optionalValue._16_8_ != puVar5) {
    operator_delete((void *)imRead.metadata.cameraFromWorld.optionalValue._16_8_,
                    CONCAT71(imRead.metadata.cameraFromWorld.optionalValue._33_7_,
                             imRead.metadata.cameraFromWorld.optionalValue.__data[0x20]) + 1);
  }
  if ((optional<pbrt::SquareMatrix<4>_> *)imRead.image.p32.nStored != poVar4) {
    operator_delete((void *)imRead.image.p32.nStored,
                    CONCAT71(imRead.metadata.cameraFromWorld.optionalValue._1_7_,
                             imRead.metadata.cameraFromWorld.optionalValue.__data[0]) + 1);
  }
  if ((float **)imRead.image.p16.nStored != ppfVar3) {
    operator_delete((void *)imRead.image.p16.nStored,
                    CONCAT71(imRead.image.p32.ptr._1_7_,imRead.image.p32.ptr._0_1_) + 1);
  }
  if ((Half **)imRead.image.p8.nStored != ppHVar2) {
    operator_delete((void *)imRead.image.p8.nStored,
                    CONCAT71(imRead.image.p16.ptr._1_7_,imRead.image.p16.ptr._0_1_) + 1);
  }
  if (imRead.image.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits != (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )ppuVar1) {
    operator_delete((void *)imRead.image.encoding.
                            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                            .bits,CONCAT71(imRead.image.p8.ptr._1_7_,imRead.image.p8.ptr._0_1_) + 1)
    ;
  }
  ppcVar8 = argv_local;
  if ((char)imRead.image.channelNames.nStored == '\x01') {
    imRead.image.channelNames.nStored._0_1_ = 0;
  }
  if ((char)imRead.image.channelNames.nAlloc == '\x01') {
    imRead.image.channelNames.nAlloc._0_1_ = 0;
  }
  if (argc < 2) {
    help();
  }
  else {
    __s1 = argv_local[1];
    pcVar21 = __s1;
    iVar12 = strcmp(__s1,"average");
    if (iVar12 == 0) {
      iVar12 = average((int)pcVar21,ppcVar8 + 2);
      return iVar12;
    }
    iVar12 = strcmp(__s1,"assemble");
    if (iVar12 == 0) {
      assemble(argc + -2,ppcVar8 + 2);
    }
    else {
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"bloom");
      if (iVar12 == 0) {
        iVar12 = bloom((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      iVar12 = strcmp(__s1,"cat");
      if (iVar12 == 0) {
        iVar12 = cat(argc + -2,ppcVar8 + 2);
        return iVar12;
      }
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"convert");
      if (iVar12 == 0) {
        iVar12 = convert((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"diff");
      if (iVar12 == 0) {
        iVar12 = diff((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"denoise");
      if (iVar12 == 0) {
        iVar12 = denoise((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"error");
      if (iVar12 == 0) {
        iVar12 = error((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      pcVar21 = __s1;
      iVar12 = strcmp(__s1,"falsecolor");
      if (iVar12 == 0) {
        iVar12 = falsecolor((int)pcVar21,ppcVar8 + 2);
        return iVar12;
      }
      iVar12 = strcmp(__s1,"help");
      if ((((iVar12 == 0) || (iVar12 = strcmp(__s1,"-help"), iVar12 == 0)) ||
          (iVar12 = strcmp(__s1,"--help"), iVar12 == 0)) ||
         (iVar12 = strcmp(__s1,"-h"), iVar12 == 0)) {
        iVar12 = help(argc + -2,ppcVar8 + 2);
        return iVar12;
      }
      iVar12 = strcmp(__s1,"info");
      if (iVar12 == 0) {
        info(argc + -2,ppcVar8 + 2);
      }
      else {
        pcVar21 = __s1;
        iVar12 = strcmp(__s1,"makeequiarea");
        if (iVar12 == 0) {
          makeequiarea((int)pcVar21,ppcVar8 + 2);
        }
        else {
          pcVar21 = __s1;
          iVar12 = strcmp(__s1,"makeemitters");
          if (iVar12 == 0) {
            iVar12 = makeemitters((int)pcVar21,ppcVar8 + 2);
            return iVar12;
          }
          pcVar21 = __s1;
          iVar12 = strcmp(__s1,"makesky");
          if (iVar12 == 0) {
            makesky((int)pcVar21,ppcVar8 + 2);
          }
          else {
            pcVar21 = __s1;
            iVar12 = strcmp(__s1,"whitebalance");
            if (iVar12 == 0) {
              iVar12 = whitebalance((int)pcVar21,ppcVar8 + 2);
              return iVar12;
            }
            iVar12 = strcmp(__s1,"noisybit");
            if (iVar12 != 0) {
              main_cold_1();
              return 1;
            }
            argv_local = ppcVar8 + 2;
            filename._M_dataplus._M_p = (pointer)&filename.field_2;
            filename._M_string_length = 0;
            filename.field_2._M_local_buf[0] = '\0';
            pixel._M_elems[0] = 0;
            pixel._M_elems[1] = 0;
            width = 10;
            sigma = 1.0;
            nInstances = 100;
            if (ppcVar8[2] != (char *)0x0) {
              local_3d8 = &local_398.field_2;
              local_3c8 = &local_358.field_2;
              do {
                imRead.image._0_8_ = &imRead.image.channelNames;
                std::__cxx11::string::_M_construct<char_const*>((string *)&imRead,"pixel","");
                local_2b8 = 0;
                uStack_2b0 = 0;
                local_2a0 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                            ::_M_invoke;
                local_2a8 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                            ::_M_manager;
                out.n = (size_t)&local_2b8;
                out.ptr = (int *)0x2;
                onError = (_Any_data *)0x2;
                bVar9 = pbrt::ParseArg<pstd::span<int>>
                                  ((pbrt *)&argv_local,(char ***)&imRead,(string *)&pixel,out,in_R9)
                ;
                bVar11 = true;
                if (bVar9) {
LAB_001d3fd4:
                  bVar10 = false;
                  bVar6 = false;
                }
                else {
                  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"width","");
                  local_2d8._M_unused._M_object = (void *)0x0;
                  local_2d8._8_8_ = 0;
                  local_2c0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                              ::_M_invoke;
                  local_2c8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                              ::_M_manager;
                  onError = &local_2d8;
                  bVar10 = pbrt::ParseArg<int*>
                                     (&argv_local,&local_398,&width,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)onError);
                  if (bVar10) goto LAB_001d3fd4;
                  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"sigma","");
                  local_2f8._M_unused._M_object = (void *)0x0;
                  local_2f8._8_8_ = 0;
                  local_2e0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                              ::_M_invoke;
                  local_2e8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                              ::_M_manager;
                  onError = &local_2f8;
                  bVar11 = pbrt::ParseArg<float*>
                                     (&argv_local,&local_358,&sigma,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)onError);
                  if (bVar11) {
                    bVar6 = true;
                    bVar10 = false;
                    bVar11 = true;
                  }
                  else {
                    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"n","");
                    local_318._M_unused._M_object = (void *)0x0;
                    local_318._8_8_ = 0;
                    local_300 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                                ::_M_invoke;
                    local_308 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp:2337:28)>
                                ::_M_manager;
                    onError = &local_318;
                    bVar11 = pbrt::ParseArg<int*>
                                       (&argv_local,&local_338,&nInstances,
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)onError);
                    bVar10 = true;
                    bVar6 = true;
                  }
                }
                if (bVar10) {
                  if (local_308 != (code *)0x0) {
                    (*local_308)(&local_318,&local_318,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    local_338.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar6) {
                  if (local_2e8 != (code *)0x0) {
                    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    local_358.field_2._M_allocated_capacity + 1);
                  }
                }
                if (!bVar9) {
                  if (local_2c8 != (code *)0x0) {
                    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != &local_398.field_2) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_2a8 != (code *)0x0) {
                  (*local_2a8)(&local_2b8,&local_2b8,3);
                }
                if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)imRead.image._0_8_ != &imRead.image.channelNames) {
                  operator_delete((void *)imRead.image._0_8_,
                                  CONCAT44(imRead.image.channelNames.alloc.memoryResource._4_4_,
                                           imRead.image.channelNames.alloc.memoryResource._0_4_) + 1
                                 );
                }
                if (bVar11 == false) {
                  if (filename._M_string_length != 0) {
                    pbrt::StringPrintf<char*&>
                              ((string *)&imRead,(pbrt *)"unexpected argument \"%s\"",
                               (char *)argv_local,(char **)onError);
                    usage("%s",(char *)imRead.image._0_8_);
                  }
                  std::__cxx11::string::operator=((string *)&filename,*argv_local);
                  argv_local = argv_local + 1;
                }
              } while (*argv_local != (char *)0x0);
            }
            if (filename._M_string_length == 0) {
              pbrt::LogFatal<char_const(&)[18]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp"
                         ,0x930,"Check failed: %s",(char (*) [18])"!filename.empty()");
            }
            AVar14.memoryResource = pstd::pmr::new_delete_resource();
            local_298.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            pbrt::Image::Read(&imRead,&filename,AVar14,&local_298);
            image._0_8_ = &image.channelNames;
            std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
            image.channelNames.nAlloc = (size_t)&image.encoding;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&image.channelNames.nAlloc,"G","");
            psVar19 = &image.p8.nStored;
            image.p8.ptr = (uchar *)psVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)&image.p8.ptr,"B","");
            requestedChannels.n = 3;
            requestedChannels.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
            pbrt::Image::GetChannelDesc(&rgbDesc,&imRead.image,requestedChannels);
            lVar23 = -0x60;
            do {
              if (psVar19 != (size_t *)psVar19[-2]) {
                operator_delete((long *)psVar19[-2],*psVar19 + 1);
              }
              psVar19 = psVar19 + -4;
              lVar23 = lVar23 + 0x20;
            } while (lVar23 != 0);
            if (rgbDesc.offset.nStored == 0) {
              pbrt::LogFatal<char_const(&)[14]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp"
                         ,0x934,"Check failed: %s",(char (*) [14])"(bool)rgbDesc");
            }
            AVar14.memoryResource = pstd::pmr::new_delete_resource();
            pbrt::Image::SelectChannels(&image,&imRead.image,&rgbDesc,AVar14);
            if (((pixel._M_elems[0] < width) ||
                (image.resolution.super_Tuple2<pbrt::Point2,_int>.x <= width + pixel._M_elems[0]))
               || (image.resolution.super_Tuple2<pbrt::Point2,_int>.y <= width + pixel._M_elems[0]))
            {
              fprintf(_stderr,
                      "%s: pixel (%d, %d) with width %d doesn\'t work with resolution (%d, %d).\n",
                      filename._M_dataplus._M_p,(ulong)pixel._M_elems & 0xffffffff,
                      (ulong)pixel._M_elems & 0xffffffff,(ulong)(uint)width,
                      CONCAT44(image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                               image.resolution.super_Tuple2<pbrt::Point2,_int>.x),
                      (ulong)(uint)image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
              iVar12 = 1;
            }
            else {
              iVar12 = width * 2 + 1;
              vb = iVar12 * iVar12;
              va = nInstances * 3;
              if (va < vb) {
                pbrt::
                LogFatal<char_const(&)[15],char_const(&)[8],char_const(&)[15],int&,char_const(&)[8],int&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/imgtool.cpp"
                           ,0x942,"Check failed: %s >= %s with %s = %s, %s = %s",
                           (char (*) [15])"3 * nInstances",(char (*) [8])"nPixels",
                           (char (*) [15])"3 * nInstances",&va,(char (*) [8])"nPixels",&vb);
              }
              pFVar15 = fopen("m.csv","w");
              if (0 < nInstances) {
                uVar22 = 0x853c49e6748fea9b;
                local_3b4 = 0;
                do {
                  iVar12 = 0;
                  do {
                    if (-1 < width) {
                      iVar20 = -width;
                      do {
                        iVar24 = -width;
                        if (SBORROW4(width,-width) == width * 2 < 0) {
                          do {
                            uVar13 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
                            bVar16 = (byte)(uVar22 >> 0x3b);
                            auVar25 = vcvtusi2ss_avx512f(in_XMM3,uVar13 >> bVar16 |
                                                                 uVar13 << 0x20 - bVar16);
                            auVar25 = vminss_avx(ZEXT416((uint)(auVar25._0_4_ * 2.3283064e-10)),
                                                 ZEXT416(0x3f7fffff));
                            auVar25 = vfmadd132ss_fma(auVar25,SUB6416(ZEXT464(0xbf800000),0),
                                                      ZEXT416(0x40000000));
                            local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(local_3d8._4_4_,auVar25._0_4_);
                            auVar25 = vfnmadd213ss_fma(auVar25,auVar25,ZEXT416(0x3f800000));
                            auVar25 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar25);
                            auVar28._0_4_ = logf(auVar25._0_4_);
                            iVar7 = width;
                            auVar28._4_60_ = extraout_var;
                            if (0x7f7fffff < (uint)ABS(auVar28._0_4_)) {
                              pbrt::LogFatal<char_const(&)[28]>
                                        (Fatal,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.h"
                                         ,0x2a6,"Check failed: %s",
                                         (char (*) [28])"!IsNaN(t) && !std::isinf(t)");
                            }
                            auVar25._8_4_ = 0x7fffffff;
                            auVar25._0_8_ = 0x7fffffff7fffffff;
                            auVar25._12_4_ = 0x7fffffff;
                            auVar27 = auVar28._0_16_;
                            auVar25 = vandps_avx512vl(auVar27,auVar25);
                            if (auVar25._0_4_ <= 6.125) {
                              auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar27,
                                                        ZEXT416(0x3419da2c));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x35a4c94e));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x33f295dd));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xb86b8609));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xb91adf4d));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b17b201));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3c3d0f26));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xbe6d9577));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3f62dfc4));
                              uVar29 = auVar25._0_4_;
                            }
                            else {
                              auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar27,
                                                        ZEXT416(0x32fbe4d7));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x35a3f289));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x37ee53ef));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x39ce55c9));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b46606f));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3b9e5490));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0xbe877fb3));
                              auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416(0x3f570b52));
                              uVar29 = auVar25._0_4_;
                            }
                            local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(local_3c8._4_4_,uVar29);
                            p.super_Tuple2<pbrt::Point2,_int>.x = pixel._M_elems[0] + iVar20;
                            p.super_Tuple2<pbrt::Point2,_int>.y = pixel._M_elems[1] + iVar24;
                            FVar26 = pbrt::Image::GetChannel
                                               (&image,p,iVar12,(WrapMode2D)0x200000002);
                            uVar22 = uVar22 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
                            iVar18 = -iVar7;
                            uVar17 = 0x20;
                            if (iVar24 != iVar18 && SBORROW4(iVar24,iVar18) == iVar24 + iVar7 < 0) {
                              uVar17 = 0x2c;
                            }
                            if (iVar20 != iVar18 && SBORROW4(iVar20,iVar18) == iVar20 + iVar7 < 0) {
                              uVar17 = 0x2c;
                            }
                            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(local_3c8._0_4_ *
                                                                    local_3d8._0_4_)),
                                                      SUB6416(ZEXT464(0x3e10d0c3),0),ZEXT416(0));
                            fprintf(pFVar15,"%c%f ",(double)(auVar25._0_4_ + FVar26),uVar17);
                            bVar9 = iVar24 < width;
                            iVar24 = iVar24 + 1;
                          } while (bVar9);
                        }
                        bVar9 = iVar20 < width;
                        iVar20 = iVar20 + 1;
                      } while (bVar9);
                    }
                    fputc(10,pFVar15);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 != 3);
                  local_3b4 = local_3b4 + 1;
                } while (local_3b4 < nInstances);
              }
              fclose(pFVar15);
              pFVar15 = fopen("b.csv","w");
              if (0 < nInstances) {
                iVar12 = 0;
                do {
                  iVar20 = 0;
                  do {
                    FVar26 = pbrt::Image::GetChannel
                                       (&image,(Point2i)pixel._M_elems,iVar20,
                                        (WrapMode2D)0x200000002);
                    fprintf(pFVar15,"%f\n",(double)FVar26);
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != 3);
                  iVar12 = iVar12 + 1;
                } while (iVar12 < nInstances);
              }
              fclose(pFVar15);
              iVar12 = 0;
            }
            pbrt::Image::~Image(&image);
            pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                      (&rgbDesc.offset);
            pbrt::ImageAndMetadata::~ImageAndMetadata(&imRead);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)filename._M_dataplus._M_p != &filename.field_2) {
              operator_delete(filename._M_dataplus._M_p,
                              CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                       filename.field_2._M_local_buf[0]) + 1);
            }
            if (iVar12 != 0) {
              return iVar12;
            }
            pbrt::CleanupPBRT();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    InitPBRT({});

    if (argc < 2) {
        help();
        return 0;
    }

    if (strcmp(argv[1], "average") == 0)
        return average(argc - 2, argv + 2);
    else if (strcmp(argv[1], "assemble") == 0)
        return assemble(argc - 2, argv + 2);
    else if (strcmp(argv[1], "bloom") == 0)
        return bloom(argc - 2, argv + 2);
    else if (strcmp(argv[1], "cat") == 0)
        return cat(argc - 2, argv + 2);
    else if (strcmp(argv[1], "convert") == 0)
        return convert(argc - 2, argv + 2);
    else if (strcmp(argv[1], "diff") == 0)
        return diff(argc - 2, argv + 2);
    else if (strcmp(argv[1], "denoise") == 0)
        return denoise(argc - 2, argv + 2);
#ifdef PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "denoise-optix") == 0)
        return denoise_optix(argc - 2, argv + 2);
#endif  // PBRT_BUILD_GPU_RENDERER
    else if (strcmp(argv[1], "error") == 0)
        return error(argc - 2, argv + 2);
    else if (strcmp(argv[1], "falsecolor") == 0)
        return falsecolor(argc - 2, argv + 2);
    else if (strcmp(argv[1], "help") == 0 || strcmp(argv[1], "-help") == 0 ||
             strcmp(argv[1], "--help") == 0 || strcmp(argv[1], "-h") == 0)
        return help(argc - 2, argv + 2);
    else if (strcmp(argv[1], "info") == 0)
        return info(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeequiarea") == 0)
        return makeequiarea(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makeemitters") == 0)
        return makeemitters(argc - 2, argv + 2);
    else if (strcmp(argv[1], "makesky") == 0)
        return makesky(argc - 2, argv + 2);
    else if (strcmp(argv[1], "whitebalance") == 0)
        return whitebalance(argc - 2, argv + 2);
    else if (strcmp(argv[1], "noisybit") == 0) {
        // hack for brute force comptuation of ideal filter weights.

        argv += 2;
        std::string filename;
        std::array<int, 2> pixel = {0, 0};
        int width = 10;
        Float sigma = 1;
        int nInstances = 100;

        while (*argv != nullptr) {
            auto onError = [](const std::string &err) {
                usage("%s", err.c_str());
                exit(1);
            };
            if (ParseArg(&argv, "pixel", pstd::MakeSpan(pixel), onError) ||
                ParseArg(&argv, "width", &width, onError) ||
                ParseArg(&argv, "sigma", &sigma, onError) ||
                ParseArg(&argv, "n", &nInstances, onError))
                ;  // yaay
            else if (filename.empty()) {
                filename = *argv;
                ++argv;
            } else
                onError(StringPrintf("unexpected argument \"%s\"", *argv));
        }
        CHECK(!filename.empty());

        ImageAndMetadata imRead = Image::Read(filename);
        ImageChannelDesc rgbDesc = imRead.image.GetChannelDesc({"R", "G", "B"});
        CHECK((bool)rgbDesc);
        Image image = imRead.image.SelectChannels(rgbDesc);

        if (pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().x ||
            pixel[0] - width < 0 || pixel[0] + width >= image.Resolution().y) {
            fprintf(stderr,
                    "%s: pixel (%d, %d) with width %d doesn't work with "
                    "resolution (%d, %d).\n",
                    filename.c_str(), pixel[0], pixel[0], width, image.Resolution().x,
                    image.Resolution().y);
            return 1;
        }

        int nPixels = Sqr(2 * width + 1);
        CHECK_GE(3 * nInstances, nPixels);  // want to be overconstrained

        RNG rng;
        //
        FILE *f = fopen("m.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c) {
                for (int dx = -width; dx <= width; ++dx)
                    for (int dy = -width; dy <= width; ++dy) {
                        // Float noise = .1 * std::exp(-rng.Uniform<Float>() *
                        // 3); if (rng.Uniform<Float>() < .5) noise = -noise;
                        Float noise = SampleNormal(rng.Uniform<Float>(), 0., .1);
                        // TODO: use sigma, make this controllable, etc.
                        fprintf(f, "%c%f ", (dx > -width || dy > -width) ? ',' : ' ',
                                image.GetChannel({pixel[0] + dx, pixel[1] + dy}, c)
                                    // *  (.95 + .05 * rng.Uniform<Float>())
                                    + noise);
                    }
                fprintf(f, "\n");
            }
        fclose(f);

        // what it should equal
        f = fopen("b.csv", "w");
        for (int i = 0; i < nInstances; ++i)
            for (int c = 0; c < 3; ++c)
                fprintf(f, "%f\n", image.GetChannel({pixel[0], pixel[1]}, c));
        fclose(f);

        /*
          LeastSquares[Import["m.csv"], Import["b.csv"]]
          ArrayPlot[ArrayReshape[ %, {21, 21}], ColorFunction -> Function[a,
          GrayLevel[4 a]]]
        */
    } else {
        fprintf(stderr, "imgtool: unknown command \"%s\"", argv[1]);
        help();
        CleanupPBRT();
        return 1;
    }